

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O1

void test_mutex_nthread(testing t)

{
  closure *cl;
  char *msg;
  int iVar1;
  int iVar2;
  nsync_time nVar3;
  nsync_time nVar4;
  test_data td;
  test_data local_98;
  
  nVar3 = nsync::nsync_time_now();
  nVar4 = nsync::nsync_time_ms(0x5dc);
  nVar3 = nsync::nsync_time_add(nVar3,nVar4);
  iVar2 = 100000;
  do {
    local_98.mu.word.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
    local_98.mu._4_4_ = 0;
    local_98.done.word.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
    local_98.done._4_4_ = 0;
    local_98.done.waiters = (nsync_dll_element_s_ *)0x0;
    local_98.rwmutex = (nsync_pthread_rwlock_)0x0;
    local_98.i = 0;
    local_98.id = 0;
    local_98.mu.waiters = (nsync_dll_element_s_ *)0x0;
    local_98.mutex = (nsync_pthread_mutex_)0x0;
    local_98.finished_threads = 0;
    local_98._100_4_ = 0;
    local_98.loop_count = iVar2;
    local_98.n_threads = 5;
    local_98.mu_in_use = &local_98.mutex;
    local_98.lock = void_pthread_mutex_lock;
    local_98.unlock = void_pthread_mutex_unlock;
    local_98.t = t;
    local_98.mutex = (nsync_pthread_mutex_)operator_new(0x28);
    ((local_98.mutex)->super___mutex_base)._M_mutex.__align = 0;
    *(undefined8 *)((long)&((local_98.mutex)->super___mutex_base)._M_mutex + 8) = 0;
    *(undefined8 *)((long)&((local_98.mutex)->super___mutex_base)._M_mutex + 0x10) = 0;
    ((local_98.mutex)->super___mutex_base)._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    ((local_98.mutex)->super___mutex_base)._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    if (local_98.n_threads != 0) {
      iVar1 = 0;
      do {
        cl = (closure *)malloc(0x20);
        cl->f0 = closure_f0_counting;
        cl[1].f0 = counting_loop;
        cl[2].f0 = (_func_void_void_ptr *)&local_98;
        *(int *)&cl[3].f0 = iVar1;
        closure_fork(cl);
        iVar1 = iVar1 + 1;
      } while (iVar1 != local_98.n_threads);
    }
    test_data_wait_for_all_threads(&local_98);
    if (local_98.i != local_98.loop_count * local_98.n_threads) {
      msg = smprintf("test_mutex_nthread final count inconsistent: want %d, got %d");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O1/cpp/testing/mu_test.c"
                     ,0xa6,msg);
    }
    if (local_98.mutex != (nsync_pthread_mutex_)0x0) {
      operator_delete(local_98.mutex);
    }
    iVar2 = iVar2 * 2;
    nVar4 = nsync::nsync_time_now();
    iVar1 = nsync::nsync_time_cmp(nVar4,nVar3);
  } while (iVar1 < 0);
  return;
}

Assistant:

static void test_mutex_nthread (testing t) {
	int loop_count = 100000;
	nsync_time deadline;
	deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (1500));
	do {
		int i;
		test_data td;
		memset ((void *) &td, 0, sizeof (td));
		td.t = t;
		td.n_threads = 5;
		td.loop_count = loop_count;
		td.mu_in_use = &td.mutex;
		td.lock = &void_pthread_mutex_lock;
		td.unlock = &void_pthread_mutex_unlock;
		pthread_mutex_init (&td.mutex, NULL);
		for (i = 0; i != td.n_threads; i++) {
			closure_fork (closure_counting (&counting_loop, &td, i));
		}
		test_data_wait_for_all_threads (&td);
		if (td.i != td.n_threads*td.loop_count) {
			TEST_FATAL (t, ("test_mutex_nthread final count inconsistent: want %d, got %d",
				   td.n_threads*td.loop_count, td.i));
		}
		pthread_mutex_destroy (&td.mutex);
		loop_count *= 2;
	} while (nsync_time_cmp (nsync_time_now (), deadline) < 0);
}